

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

void __thiscall CSubNet::CSubNet(CSubNet *this,CNetAddr *addr)

{
  int iVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CSubNet *in_stack_ffffffffffffffb8;
  CNetAddr *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  size_type in_stack_ffffffffffffffcc;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet(in_stack_ffffffffffffffb8);
  iVar1 = *(int *)(in_RSI + 0x18);
  if (iVar1 != 0) {
    if (iVar1 - 1U < 2) {
      *(undefined1 *)(in_RDI + 0x30) = 1;
      in_stack_ffffffffffffffcc =
           prevector<16U,_unsigned_char,_unsigned_int,_int>::size
                     ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (0x10 < in_stack_ffffffffffffffcc) {
        __assert_fail("addr.m_addr.size() <= sizeof(netmask)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                      ,1000,"CSubNet::CSubNet(const CNetAddr &)");
      }
      in_stack_ffffffffffffffc0 = (CNetAddr *)(in_RDI + 0x20);
      in_stack_ffffffffffffffc8 =
           prevector<16U,_unsigned_char,_unsigned_int,_int>::size
                     ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      memset(in_stack_ffffffffffffffc0,0xff,(ulong)in_stack_ffffffffffffffc8);
    }
    else if (iVar1 - 3U < 3) {
      *(undefined1 *)(in_RDI + 0x30) = 1;
    }
    else if (iVar1 - 6U < 2) goto LAB_019812e2;
    CNetAddr::operator=((CNetAddr *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                        in_stack_ffffffffffffffc0);
  }
LAB_019812e2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

CSubNet::CSubNet(const CNetAddr& addr) : CSubNet()
{
    switch (addr.m_net) {
    case NET_IPV4:
    case NET_IPV6:
        valid = true;
        assert(addr.m_addr.size() <= sizeof(netmask));
        memset(netmask, 0xFF, addr.m_addr.size());
        break;
    case NET_ONION:
    case NET_I2P:
    case NET_CJDNS:
        valid = true;
        break;
    case NET_INTERNAL:
    case NET_UNROUTABLE:
    case NET_MAX:
        return;
    }

    network = addr;
}